

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

printer * __thiscall boost::ext::ut::v1_1_8::printer::operator<<(printer *this,char **t)

{
  undefined1 *puVar1;
  char *__s;
  size_t sVar2;
  
  puVar1 = &this->field_0x40;
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)puVar1 + (int)*(undefined8 *)(*(long *)puVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,__s,sVar2);
  }
  return this;
}

Assistant:

auto& operator<<(const T& t) {
      out_ << detail::get(t);
      return *this;
    }